

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.c
# Opt level: O0

int onig_unicode_define_user_property(char *name,OnigCodePoint *ranges)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  OnigUChar *str_key;
  long lVar4;
  OnigUChar *uname;
  char *s;
  int c;
  int len;
  int n;
  int i;
  int r;
  UserDefinedPropertyValue *e;
  OnigCodePoint *ranges_local;
  char *name_local;
  
  if (UserDefinedPropertyNum < 0x14) {
    sVar3 = strlen(name);
    iVar2 = (int)sVar3;
    if (iVar2 < 0x3d) {
      str_key = (OnigUChar *)malloc((long)(iVar2 + 1));
      if (str_key == (OnigUChar *)0x0) {
        name_local._4_4_ = -5;
      }
      else {
        c = 0;
        for (len = 0; len < iVar2; len = len + 1) {
          bVar1 = name[len];
          if ((bVar1 < 0x20) || (0x7f < bVar1)) {
            free(str_key);
            return -0xdf;
          }
          if (((bVar1 != 0x20) && (bVar1 != 0x2d)) && (bVar1 != 0x5f)) {
            str_key[c] = bVar1;
            c = c + 1;
          }
        }
        str_key[c] = '\0';
        if ((UserDefinedPropertyTable == (st_table *)0x0) &&
           (UserDefinedPropertyTable = (st_table *)onig_st_init_strend_table_with_size(10),
           UserDefinedPropertyTable == (st_table *)0x0)) {
          free(str_key);
          name_local._4_4_ = -5;
        }
        else {
          lVar4 = (long)UserDefinedPropertyNum;
          UserDefinedPropertyRanges[lVar4].ctype = UserDefinedPropertyNum + 0x275;
          UserDefinedPropertyRanges[lVar4].ranges = ranges;
          name_local._4_4_ =
               onig_st_insert_strend
                         (UserDefinedPropertyTable,str_key,str_key + c,
                          (hash_data_type)(UserDefinedPropertyRanges + lVar4));
          if (-1 < name_local._4_4_) {
            UserDefinedPropertyNum = UserDefinedPropertyNum + 1;
            name_local._4_4_ = 0;
          }
        }
      }
    }
    else {
      name_local._4_4_ = -0x195;
    }
  }
  else {
    name_local._4_4_ = -0x194;
  }
  return name_local._4_4_;
}

Assistant:

extern int
onig_unicode_define_user_property(const char* name, OnigCodePoint* ranges)
{
  UserDefinedPropertyValue* e;
  int r;
  int i;
  int n;
  int len;
  int c;
  char* s;
  UChar* uname;

  if (UserDefinedPropertyNum >= USER_DEFINED_PROPERTY_MAX_NUM)
    return ONIGERR_TOO_MANY_USER_DEFINED_OBJECTS;

  len = (int )strlen(name);
  if (len >= PROPERTY_NAME_MAX_SIZE)
    return ONIGERR_TOO_LONG_PROPERTY_NAME;

  s = (char* )xmalloc(len + 1);
  if (s == 0)
    return ONIGERR_MEMORY;

  uname = (UChar* )name;
  n = 0;
  for (i = 0; i < len; i++) {
    c = uname[i];
    if (c < 0x20 || c >= 0x80) {
      xfree(s);
      return ONIGERR_INVALID_CHAR_PROPERTY_NAME;
    }

    if (c != ' ' && c != '-' && c != '_') {
      s[n] = c;
      n++;
    }
  }
  s[n] = '\0';

  if (UserDefinedPropertyTable == 0) {
    UserDefinedPropertyTable = onig_st_init_strend_table_with_size(10);
    if (IS_NULL(UserDefinedPropertyTable)) {
      xfree(s);
      return ONIGERR_MEMORY;
    }
  }

  e = UserDefinedPropertyRanges + UserDefinedPropertyNum;
  e->ctype = CODE_RANGES_NUM + UserDefinedPropertyNum;
  e->ranges = ranges;
  r = onig_st_insert_strend(UserDefinedPropertyTable,
                            (const UChar* )s, (const UChar* )s + n,
                            (hash_data_type )((void* )e));
  if (r < 0) return r;

  UserDefinedPropertyNum++;
  return 0;
}